

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O1

void anon_unknown.dwarf_7d1152::compare_fp_stats_md5(aom_fixed_buf_t *fp_stats)

{
  uchar *buf;
  ulong uVar1;
  char *lhs;
  char *rhs;
  SEARCH_METHODS *message;
  AssertionResult gtest_ar;
  MD5 md5_row_mt_1;
  MD5 md5_row_mt_0;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  AssertHelper local_138;
  internal local_130 [8];
  undefined8 *local_128;
  MD5 local_120;
  MD5 local_a4;
  
  buf = (uchar *)fp_stats->buf;
  uVar1 = fp_stats->sz;
  MD5Init(&local_a4.md5_);
  MD5Init(&local_120.md5_);
  MD5Update(&local_a4.md5_,buf,(uint)(fp_stats->sz >> 1));
  lhs = libaom_test::MD5::Get(&local_a4);
  MD5Update(&local_120.md5_,buf + (uVar1 >> 1),(uint)(fp_stats->sz >> 1));
  rhs = libaom_test::MD5::Get(&local_120);
  testing::internal::CmpHelperSTREQ(local_130,"md5_row_mt_0_str","md5_row_mt_1_str",lhs,rhs);
  if (local_130[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_140);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               ((long)local_140._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x10),"MD5 checksums don\'t match",0x19);
    if (local_128 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*local_128;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/ethread_test.cc"
               ,0x82,(char *)message);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_140._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_140._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_128 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_128 != local_128 + 2) {
      operator_delete((undefined8 *)*local_128);
    }
    operator_delete(local_128);
  }
  return;
}

Assistant:

static void compare_fp_stats_md5(aom_fixed_buf_t *fp_stats) {
  // fp_stats consists of 2 set of first pass encoding stats. These 2 set of
  // stats are compared to check if the stats match.
  uint8_t *stats1 = reinterpret_cast<uint8_t *>(fp_stats->buf);
  uint8_t *stats2 = stats1 + fp_stats->sz / 2;
  ::libaom_test::MD5 md5_row_mt_0, md5_row_mt_1;

  md5_row_mt_0.Add(stats1, fp_stats->sz / 2);
  const char *md5_row_mt_0_str = md5_row_mt_0.Get();

  md5_row_mt_1.Add(stats2, fp_stats->sz / 2);
  const char *md5_row_mt_1_str = md5_row_mt_1.Get();

  // Check md5 match.
  ASSERT_STREQ(md5_row_mt_0_str, md5_row_mt_1_str)
      << "MD5 checksums don't match";
}